

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# were.c
# Opt level: O0

int were_summon(permonst *ptr,boolean yours,int *visible,char *genbuf)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  monst *worm;
  int local_54;
  int local_4c;
  int total;
  monst *mtmp;
  int local_38;
  int pm;
  int typ;
  int i;
  char *genbuf_local;
  int *visible_local;
  boolean yours_local;
  permonst *ptr_local;
  
  iVar2 = monsndx(ptr);
  local_4c = 0;
  *visible = 0;
  if (((u.uprops[0x17].intrinsic == 0) && (u.uprops[0x17].extrinsic == 0)) || (yours != '\0')) {
    for (pm = rnd(5); 0 < pm; pm = pm + -1) {
      if (iVar2 == 0x11) {
LAB_0033a6f7:
        local_38 = 0xe;
        if (genbuf != (char *)0x0) {
          strcpy(genbuf,"jackal");
        }
LAB_0033a754:
        worm = makemon(mons + local_38,level,(int)u.ux,(int)u.uy,0);
        if (worm != (monst *)0x0) {
          local_4c = local_4c + 1;
          if (worm->wormno == '\0') {
            if ((viz_array[worm->my][worm->mx] & 2U) == 0) {
              if (((((u.uprops[0x1e].intrinsic != 0) ||
                    ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                   (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
                  ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
                 (((u.uprops[0x40].intrinsic == 0 &&
                   ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0))))
                  || ((worm->data->mflags3 & 0x200) == 0)))) goto LAB_0033a997;
              bVar1 = viz_array[worm->my][worm->mx] & 1;
              goto joined_r0x0033a8fb;
            }
          }
          else {
            bVar1 = worm_known(level,worm);
joined_r0x0033a8fb:
            if (bVar1 == 0) goto LAB_0033a997;
          }
          if ((((((*(uint *)&worm->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
             ((((*(uint *)&worm->field_0x60 >> 7 & 1) == 0 &&
               ((*(uint *)&worm->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))
             ) {
            *visible = *visible + 1;
          }
        }
LAB_0033a997:
        if ((yours != '\0') && (worm != (monst *)0x0)) {
          tamedog(worm,(obj *)0x0);
        }
      }
      else {
        if (iVar2 == 0x17) {
LAB_0033a717:
          iVar3 = rn2(5);
          local_38 = 0x1a;
          if (iVar3 != 0) {
            local_38 = 0x16;
          }
          if (genbuf != (char *)0x0) {
            strcpy(genbuf,"wolf");
          }
          goto LAB_0033a754;
        }
        if ((iVar2 == 0x5d) || (iVar2 == 0x10e)) {
          iVar3 = rn2(3);
          if (iVar3 == 0) {
            iVar3 = rn2(3);
            local_54 = 0x5c;
            if (iVar3 != 0) {
              local_54 = 0x5b;
            }
          }
          else {
            local_54 = 0x5a;
          }
          local_38 = local_54;
          if (genbuf != (char *)0x0) {
            strcpy(genbuf,"rat");
          }
          goto LAB_0033a754;
        }
        if (iVar2 == 0x10f) goto LAB_0033a6f7;
        if (iVar2 == 0x110) goto LAB_0033a717;
      }
    }
    ptr_local._4_4_ = local_4c;
  }
  else {
    ptr_local._4_4_ = 0;
  }
  return ptr_local._4_4_;
}

Assistant:

int were_summon(const struct permonst *ptr, boolean yours,
		int *visible,	/* number of visible helpers created */
		char *genbuf)
{
	int i, typ, pm = monsndx(ptr);
	struct monst *mtmp;
	int total = 0;

	*visible = 0;
	if (Protection_from_shape_changers && !yours)
		return 0;
	for (i = rnd(5); i > 0; i--) {
	   switch(pm) {

		case PM_WERERAT:
		case PM_HUMAN_WERERAT:
			typ = rn2(3) ? PM_SEWER_RAT : rn2(3) ? PM_GIANT_RAT : PM_RABID_RAT ;
			if (genbuf) strcpy(genbuf, "rat");
			break;
		case PM_WEREJACKAL:
		case PM_HUMAN_WEREJACKAL:
			typ = PM_JACKAL;
			if (genbuf) strcpy(genbuf, "jackal");
			break;
		case PM_WEREWOLF:
		case PM_HUMAN_WEREWOLF:
			typ = rn2(5) ? PM_WOLF : PM_WINTER_WOLF ;
			if (genbuf) strcpy(genbuf, "wolf");
			break;
		default:
			continue;
	    }
	    mtmp = makemon(&mons[typ], level, u.ux, u.uy, NO_MM_FLAGS);
	    if (mtmp) {
		total++;
		if (canseemon(level, mtmp)) *visible += 1;
	    }
	    if (yours && mtmp)
		tamedog(mtmp, NULL);
	}
	return total;
}